

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld
          (DescriptorPool *this,StringPiece name)

{
  pointer pTVar1;
  FileDescriptor *__s;
  string *psVar2;
  FileOptions *pFVar3;
  FileDescriptorTables *pFVar4;
  SourceCodeInfo *pSVar5;
  FileDescriptor *placeholder;
  DescriptorPool *this_local;
  StringPiece name_local;
  
  if (this->mutex_ != (WrappedMutex *)0x0) {
    internal::WrappedMutex::AssertHeld(this->mutex_);
  }
  pTVar1 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  __s = Tables::Allocate<google::protobuf::FileDescriptor>(pTVar1);
  memset(__s,0,0x90);
  pTVar1 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  psVar2 = Tables::AllocateString_abi_cxx11_(pTVar1,name);
  *(string **)__s = psVar2;
  psVar2 = internal::GetEmptyString_abi_cxx11_();
  *(string **)(__s + 8) = psVar2;
  *(DescriptorPool **)(__s + 0x10) = this;
  pFVar3 = FileOptions::default_instance();
  *(FileOptions **)(__s + 0x78) = pFVar3;
  pFVar4 = FileDescriptorTables::GetEmptyInstance();
  *(FileDescriptorTables **)(__s + 0x80) = pFVar4;
  pSVar5 = SourceCodeInfo::default_instance();
  *(SourceCodeInfo **)(__s + 0x88) = pSVar5;
  __s[0x38] = (FileDescriptor)0x1;
  __s[0x3a] = (FileDescriptor)0x0;
  __s[0x39] = (FileDescriptor)0x1;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    StringPiece name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(static_cast<void*>(placeholder), 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
  placeholder->finished_building_ = true;
  // All other fields are zero or nullptr.

  return placeholder;
}